

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O0

void spirv_cross::fixup_radix_point(char *str,char radix_point)

{
  char *pcStack_10;
  char radix_point_local;
  char *str_local;
  
  pcStack_10 = str;
  if (radix_point != '.') {
    for (; *pcStack_10 != '\0'; pcStack_10 = pcStack_10 + 1) {
      if (*pcStack_10 == radix_point) {
        *pcStack_10 = '.';
      }
    }
  }
  return;
}

Assistant:

static inline void fixup_radix_point(char *str, char radix_point)
{
	// Setting locales is a very risky business in multi-threaded program,
	// so just fixup locales instead. We only need to care about the radix point.
	if (radix_point != '.')
	{
		while (*str != '\0')
		{
			if (*str == radix_point)
				*str = '.';
			str++;
		}
	}
}